

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Citizen.cpp
# Opt level: O3

void Handlers::Citizen_Reply(Character *character,PacketReader *reader)

{
  World *pWVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  long lVar5;
  mapped_type *this;
  NPC_Data *pNVar6;
  undefined1 *puVar7;
  int questions_wrong;
  int iVar8;
  string *subject;
  long *plVar9;
  uint uVar10;
  PacketBuilder reply;
  string answers [3];
  undefined1 local_e8 [48];
  string local_b8;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  string local_58 [16];
  long local_48 [3];
  
  lVar5 = 0x10;
  do {
    puVar7 = (undefined1 *)((long)&local_98._M_dataplus._M_p + lVar5);
    *(undefined1 **)((long)&local_b8.field_2 + lVar5) = puVar7;
    *(undefined8 *)((long)&local_b8.field_2 + lVar5 + 8) = 0;
    *puVar7 = 0;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x70);
  PacketReader::GetShort(reader);
  PacketReader::GetByte(reader);
  PacketReader::GetShort(reader);
  PacketReader::GetByte(reader);
  PacketReader::GetBreakString_abi_cxx11_((string *)local_e8,reader,0xff);
  subject = &local_98;
  std::__cxx11::string::operator=((string *)subject,(string *)local_e8);
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  PacketReader::GetBreakString_abi_cxx11_((string *)local_e8,reader,0xff);
  std::__cxx11::string::operator=((string *)local_78[0]._M_local_buf,(string *)local_e8);
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  PacketReader::GetEndString_abi_cxx11_((string *)local_e8,reader);
  std::__cxx11::string::operator=(local_58,(string *)local_e8);
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if (character->npc_type == Inn) {
    if ((character->home)._M_string_length != 0) {
      pWVar1 = character->world;
      local_e8._0_8_ = local_e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,"CitizenSubscribeAnytime","");
      this = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar1->config,(key_type *)local_e8);
      bVar3 = util::variant::GetBool(this);
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
      }
      if (!bVar3) goto LAB_001a5852;
    }
    iVar8 = 0;
    lVar5 = 0x80;
    do {
      util::lowercase((string *)local_e8,subject);
      pNVar6 = NPC::Data(character->npc);
      util::lowercase(&local_b8,
                      (string *)
                      ((long)(((pNVar6->citizenship)._M_t.
                               super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                               .super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl)->
                             questions)._M_elems + lVar5 + -0x20));
      _Var2._M_p = local_b8._M_dataplus._M_p;
      if (local_e8._8_8_ == local_b8._M_string_length) {
        if ((pointer)local_e8._8_8_ == (pointer)0x0) {
          uVar10 = 0;
        }
        else {
          iVar4 = bcmp((void *)local_e8._0_8_,local_b8._M_dataplus._M_p,local_e8._8_8_);
          uVar10 = (uint)(iVar4 != 0);
        }
      }
      else {
        uVar10 = 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_b8.field_2) {
        operator_delete(_Var2._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
      }
      iVar8 = iVar8 + uVar10;
      subject = subject + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0xe0);
    if (iVar8 == 0) {
      NPC::Data(character->npc);
      std::__cxx11::string::_M_assign((string *)&character->home);
    }
    PacketBuilder::PacketBuilder((PacketBuilder *)local_e8,PACKET_CITIZEN,PACKET_REPLY,1);
    PacketBuilder::AddChar((PacketBuilder *)local_e8,(uchar)iVar8);
    Character::Send(character,(PacketBuilder *)local_e8);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_e8);
  }
LAB_001a5852:
  lVar5 = -0x60;
  plVar9 = local_48;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  return;
}

Assistant:

void Citizen_Reply(Character *character, PacketReader &reader)
{
	std::string answers[3];

	/*int session = */reader.GetShort();
	reader.GetByte();
	/*short npcid = */reader.GetShort();
	reader.GetByte();
	answers[0] = reader.GetBreakString();
	answers[1] = reader.GetBreakString();
	answers[2] = reader.GetEndString();

	if (character->npc_type == ENF::Inn && (character->home.size() == 0 || character->world->config["CitizenSubscribeAnytime"]))
	{
		int questions_wrong = 0;

		for (int i = 0; i < 3; ++i)
		{
			if (util::lowercase(answers[i]) != util::lowercase(character->npc->Data().citizenship->answers[i]))
			{
				++questions_wrong;
			}
		}

		if (questions_wrong == 0)
		{
			character->home = character->npc->Data().citizenship->home;
		}

		PacketBuilder reply(PACKET_CITIZEN, PACKET_REPLY, 1);
		reply.AddChar(questions_wrong);

		character->Send(reply);
	}
}